

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall
ON_TextureMapping::GetTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_SimpleArray<ON_2fPoint> *T,ON_Xform *mesh_xform,
          bool bLazy,ON_SimpleArray<int> *Tside)

{
  int iVar1;
  ON_TextureCoordinates *pOVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ON_2fPoint *tc;
  long lVar7;
  ON_SimpleArray<ON_3fPoint> T3;
  ON_SimpleArray<ON_3fPoint> local_48;
  
  if ((Tside != (ON_SimpleArray<int> *)0x0) && (-1 < Tside->m_capacity)) {
    Tside->m_count = 0;
  }
  if (bLazy) {
    bVar3 = ON_Mesh::HasTextureCoordinates(mesh);
    if ((bVar3) && (bVar3 = HasMatchingTextureCoordinates(this,&mesh->m_Ttag,mesh_xform), bVar3)) {
      if (T->m_a == (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a) {
        return true;
      }
      ON_SimpleArray<ON_2fPoint>::operator=(T,&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
      return true;
    }
    lVar5 = (long)(mesh->m_TC).m_count;
    if (0 < lVar5) {
      iVar1 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      lVar7 = 0;
      do {
        pOVar2 = (mesh->m_TC).m_a;
        if ((iVar1 == *(int *)((long)&(pOVar2->m_T).m_count + lVar7)) &&
           (bVar3 = HasMatchingTextureCoordinates
                              (this,(ON_MappingTag *)
                                    ((pOVar2->m_tag).m_mapping_id.Data4 + lVar7 + -8),mesh_xform),
           bVar3)) {
          pOVar2 = (mesh->m_TC).m_a;
          ThreeToTwoHelper(*(ON_SimpleArray<ON_3fPoint> **)((long)&(pOVar2->m_T).m_a + lVar7),
                           (ON_SimpleArray<ON_2fPoint> *)
                           (ulong)*(uint *)((long)&(pOVar2->m_T).m_count + lVar7));
          return true;
        }
        lVar7 = lVar7 + 0xb8;
      } while (lVar5 * 0xb8 - lVar7 != 0);
    }
  }
  if (this->m_type == srfp_mapping) {
    bVar3 = ON_Mesh::HasSurfaceParameters(mesh);
    if (bVar3) {
      uVar6 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      uVar4 = T->m_capacity;
      if (uVar4 < uVar6) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity(T,(long)(int)uVar6);
        uVar4 = T->m_capacity;
        uVar6 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      }
      if ((int)uVar6 <= (int)uVar4 && -1 < (int)uVar6) {
        T->m_count = uVar6;
      }
      tc = T->m_a;
      if (0 < (int)uVar4 && tc != (ON_2fPoint *)0x0) {
        memset(tc,0,(ulong)uVar4 << 3);
        tc = T->m_a;
      }
      bVar3 = GetSPTCHelper(mesh,this,&tc->x,2);
      return bVar3;
    }
    bVar3 = false;
  }
  else {
    if (-1 < T->m_capacity) {
      T->m_count = 0;
    }
    local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0080b890;
    local_48.m_a = (ON_3fPoint *)0x0;
    local_48.m_count = 0;
    local_48.m_capacity = 0;
    bVar3 = GetTextureCoordinates(this,mesh,&local_48,mesh_xform,false,Tside);
    if (bVar3) {
      ThreeToTwoHelper((ON_SimpleArray<ON_3fPoint> *)local_48.m_a,
                       (ON_SimpleArray<ON_2fPoint> *)(local_48._16_8_ & 0xffffffff));
    }
    ON_SimpleArray<ON_3fPoint>::~ON_SimpleArray(&local_48);
  }
  return bVar3;
}

Assistant:

bool ON_TextureMapping::GetTextureCoordinates(
            const ON_Mesh& mesh,
            ON_SimpleArray<ON_2fPoint>& T,
            const ON_Xform* mesh_xform,
            bool bLazy,
            ON_SimpleArray<int>* Tside
            ) const
{
  bool rc = false;
  if ( Tside )
    Tside->SetCount(0);
  if ( bLazy )
  {
    if ( HasMatchingTextureCoordinates(mesh,mesh_xform ) )
    {
      if ( T.Array() != mesh.m_T.Array() )
      {
        // different arrays - copy
        T = mesh.m_T;
      }
      return true;
    }
    else
    {
      int vcnt = mesh.m_V.Count();
      int tci, tccount = mesh.m_TC.Count();
      for ( tci = 0; tci < tccount; tci++ )
      {
        if ( vcnt == mesh.m_TC[tci].m_T.Count() )
        {
          if ( HasMatchingTextureCoordinates(mesh.m_TC[tci].m_tag,mesh_xform) )
          {
            // copy T3d[] results to T[]
            ThreeToTwoHelper(mesh.m_TC[tci].m_T,T);
            return true;
          }
        }
      }
    }
  }

  if ( ON_TextureMapping::TYPE::srfp_mapping == m_type )
  {
    if (mesh.HasSurfaceParameters())
    {
      // uv textures from surface parameterization
      T.Reserve(mesh.m_V.Count());
      T.SetCount(mesh.m_V.Count());
      T.Zero();
      rc = GetSPTCHelper(mesh, *this, &T[0].x, 2);
    }
    else
    {
      //In this case, we're just going to leave the TC array in place
      rc = false;
    }
  }
  else
  {
    T.SetCount(0);
	  ON_SimpleArray<ON_3fPoint> T3;
    if ( GetTextureCoordinates(mesh, T3, mesh_xform, false, Tside ) )
    {
      // copy T3d[] results to T[]
      ThreeToTwoHelper(T3,T);
      rc = true;
	  }
  }
	return rc;
}